

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O2

void __thiscall UtilizationWidget::drawGraph(UtilizationWidget *this)

{
  vector<Point<float>,_std::allocator<Point<float>_>_> *points_00;
  undefined8 uVar1;
  vector<Point<float>,_std::allocator<Point<float>_>_> *pvVar2;
  float *pfVar3;
  long lVar4;
  PointF scale;
  bool bVar5;
  int iVar6;
  QSize QVar7;
  QSize QVar8;
  QColor *pQVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  QPen pen;
  anon_class_4_1_24fd66d6 xPos;
  QColor color;
  anon_class_4_1_60e07675 yPos;
  anon_class_32_4_58ce38c5 drawGraph;
  vector<Point<float>,_std::allocator<Point<float>_>_> points;
  
  QVar7 = QWidget::size(&this->super_QWidget);
  QVar8 = QWidget::size(&this->super_QWidget);
  color.cspec = Invalid;
  color.ct.argb.alpha = 0xffff;
  color.ct.argb.red = 0;
  color.ct._4_6_ = 0;
  QPen::QPen(&pen);
  QPen::setWidth((int)&pen);
  drawGraph.xPos = &xPos;
  drawGraph.yPos = &yPos;
  drawGraph.color = &color;
  lVar13 = 0;
  lVar12 = 0;
  xPos.graphWidth = (float)QVar7.wd;
  yPos.graphHeight = (float)QVar8.ht;
  drawGraph.this = this;
  while( true ) {
    iVar6 = InfoProvider::getGPUCount();
    if (iVar6 <= lVar12) break;
    pQVar9 = SettingsManager::getGPUColor((int)lVar12);
    uVar1 = *(undefined8 *)pQVar9;
    color.ct._4_6_ = (undefined6)((ulong)*(undefined8 *)((long)&pQVar9->ct + 2) >> 0x10);
    color.cspec = (Spec)uVar1;
    color.ct.argb.alpha = (ushort)((ulong)uVar1 >> 0x20);
    color.ct.argb.red = (ushort)((ulong)uVar1 >> 0x30);
    QPen::setColor((QColor *)&pen);
    QPainter::setPen((QPen *)&this->painter);
    pvVar2 = (this->graphPoints).ptr;
    bVar5 = SettingsManager::isSmoothGraph();
    points_00 = (vector<Point<float>,_std::allocator<Point<float>_>_> *)
                ((long)&(pvVar2->super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar13);
    if (bVar5) {
      pfVar3 = *(float **)
                ((long)&(pvVar2->super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar13);
      lVar4 = *(long *)((long)&(pvVar2->
                               super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                               _M_impl.super__Vector_impl_data._M_finish + lVar13);
      uVar10 = lVar4 - (long)pfVar3 >> 3;
      iVar11 = (int)(((*(float *)(lVar4 + -8) - *pfVar3) * xPos.graphWidth) / 3.0);
      iVar6 = (int)uVar10;
      if (iVar6 <= iVar11) {
        iVar6 = iVar11;
      }
      if (uVar10 < (ulong)(long)iVar6) {
        scale.y = (float)QVar8.ht;
        scale.x = (float)QVar7.wd;
        PCHIPInterpolator::getInterpolatedPoints
                  ((vector<Point<float>,_std::allocator<Point<float>_>_> *)
                   &points.super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>,
                   points_00,scale,iVar6);
        UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()
                  (&drawGraph,
                   (vector<Point<float>,_std::allocator<Point<float>_>_> *)
                   &points.super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>);
        std::_Vector_base<Point<float>,_std::allocator<Point<float>_>_>::~_Vector_base
                  (&points.super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>);
      }
      else {
        UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()(&drawGraph,points_00);
      }
    }
    else {
      UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()(&drawGraph,points_00);
    }
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 0x18;
  }
  QPen::~QPen(&pen);
  return;
}

Assistant:

void UtilizationWidget::drawGraph() {
    auto graphWidth = static_cast<float>(size().width());
    auto graphHeight = static_cast<float>(size().height());

    QColor color;
    QPen pen;
    pen.setWidth(2);

    auto xPos = [graphWidth](float x) { return x * graphWidth; };
    auto yPos = [graphHeight](float y) { return graphHeight - graphHeight * y; };

    auto drawGraph = [&](const std::vector<PointF> &points) {
        QPainterPath filling;

        auto pointPos = [&](PointF point) -> QPointF {
            return {xPos(point.x), yPos(point.y)};
        };

        filling.moveTo(pointPos(points[0]));

        for (size_t i = 1; i < points.size(); i++)
            filling.lineTo(pointPos(points[i]));

        painter.drawPath(filling);

        filling.lineTo(pointPos({1.0f, 0.0f}));
        filling.lineTo(pointPos({points[0].x, 0.0f}));
        filling.lineTo(pointPos({points[0].x, points[0].y}));

        color.setAlpha(64);
        painter.fillPath(filling, QBrush(color));
    };

    for (int g = 0; g < InfoProvider::getGPUCount(); g++) {
        color = SettingsManager::getGPUColor(g);
        pen.setColor(color);
        painter.setPen(pen);

        auto &gPoints = graphPoints[g];

        if (SettingsManager::isSmoothGraph()) {
            int count = std::max(
                static_cast<int>(gPoints.size()),
                static_cast<int>(xPos(gPoints.back().x - gPoints.front().x) / 3)
            );

            if (count > gPoints.size()) {
                auto points = PCHIPInterpolator::getInterpolatedPoints(gPoints, {graphWidth, graphHeight}, count);
                drawGraph(points);
            } else {
                drawGraph(gPoints);
            }
        } else {
            drawGraph(gPoints);
        }
    }
}